

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::UpdateBean::notifyInitWalk<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (UpdateBean *this,AVisitor<hiberlite::UpdateBean> *av)

{
  string local_80;
  Scope local_60;
  
  Scope::Scope(&local_60,&av->scope);
  std::__cxx11::string::string((string *)&local_80,(string *)&local_60);
  startRow(this,&local_80,(av->rootKey).id,-1,0);
  std::__cxx11::string::~string((string *)&local_80);
  Scope::~Scope(&local_60);
  return;
}

Assistant:

void UpdateBean::notifyInitWalk(AV& av)
{
	startRow(av.getScope().table(), av.getRootId(), Database::NULL_ID,0);
}